

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Team.cpp
# Opt level: O1

void __thiscall Team::Team(Team *this,string *name,Player *player1,Player *player2)

{
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_serialize_abi_cxx11__0011d938;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_tricksWon).super__List_base<Trick_*,_std::allocator<Trick_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->_tricksWon;
  (this->_tricksWon).super__List_base<Trick_*,_std::allocator<Trick_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->_tricksWon;
  (this->_tricksWon).super__List_base<Trick_*,_std::allocator<Trick_*>_>._M_impl._M_node._M_size = 0
  ;
  std::__cxx11::string::_M_assign((string *)&this->_name);
  (this->_players)._M_elems[0] = player1;
  (this->_players)._M_elems[1] = player2;
  Player::setTeam(player1,this);
  Player::setTeam(player2,this);
  this->_gameScore = 0;
  return;
}

Assistant:

Team::Team(string name, Player *player1, Player *player2) {
    _name.assign(name);
    _players = {player1, player2};
    player1->setTeam(this);
    player2->setTeam(this);
    _gameScore = 0;
}